

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

ssize_t libtlp_read_cpld(nettlp *nt,void *buf,size_t count)

{
  void *__dest;
  uint16_t uVar1;
  ushort uVar2;
  uint16_t uVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  ssize_t sVar7;
  undefined1 *__src;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int diff;
  tlp_cpl_hdr ch;
  nettlp_hdr nh;
  iovec iov [4];
  pollfd x [1];
  char rest [16];
  ssize_t received;
  int ret;
  byte local_aa [2];
  uint16_t local_a8;
  uint16_t local_a4;
  byte local_9f;
  undefined1 local_9e [6];
  iovec local_98;
  byte *local_88;
  undefined8 local_80;
  void *local_78;
  long local_70;
  undefined1 *local_68;
  undefined8 local_60;
  pollfd local_50;
  undefined1 local_48 [24];
  long local_30;
  int local_24;
  long local_20;
  long local_18;
  long local_10;
  
  local_24 = 0;
  local_98.iov_base = local_9e;
  local_98.iov_len = 6;
  local_88 = local_aa;
  local_80 = 0xc;
  local_68 = local_48;
  local_60 = 0x10;
  local_50.fd = *(int *)(in_RDI + 0x10);
  local_50.events = 1;
  local_30 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    local_24 = poll(&local_50,1,500);
    if (local_24 < 0) {
LAB_00103509:
      return (long)local_24;
    }
    if (local_24 == 0) {
      local_24 = -1;
      piVar6 = __errno_location();
      *piVar6 = 0x3e;
      goto LAB_00103509;
    }
    if ((local_50.revents & 1U) == 0) goto LAB_00103509;
    local_78 = (void *)(local_18 + local_30);
    local_70 = local_20 - local_30;
    sVar7 = readv(*(int *)(local_10 + 0x10),&local_98,4);
    local_24 = (int)sVar7;
    if (local_24 < 0) goto LAB_00103509;
    if (((local_aa[0] & 0x1f) != 10) || ((local_aa[0] & 0x40) != 0x40)) {
      piVar6 = __errno_location();
      *piVar6 = 0x4a;
      local_24 = -1;
      goto LAB_00103509;
    }
    uVar1 = ntohs(local_a4);
    if ((uVar1 & 0xe000) != 0) {
      uVar1 = ntohs(local_a4);
      uVar2 = uVar1 & 0xe000;
      if (uVar2 == 0x2000) {
        piVar6 = __errno_location();
        *piVar6 = 0x5f;
        local_24 = -1;
        goto LAB_00103509;
      }
      if (uVar2 == 0x4000) {
        piVar6 = __errno_location();
        *piVar6 = 0x16;
        local_24 = -1;
        goto LAB_00103509;
      }
      if (uVar2 == 0x8000) {
        piVar6 = __errno_location();
        *piVar6 = 0x67;
        local_24 = -1;
        goto LAB_00103509;
      }
    }
    __dest = local_78;
    if ((local_9f & 3) != 0) {
      iVar4 = (int)local_70 - (local_9f & 3);
      if (iVar4 < 1) {
        __src = local_68 + (int)((local_9f & 3) - (int)local_70);
        uVar1 = ntohs(local_a4);
        memmove(__dest,__src,(long)(int)(uVar1 & 0xfff));
      }
      else {
        memmove(local_78,(void *)((long)local_78 + (long)(int)(local_9f & 3)),(long)iVar4);
        memmove((void *)((long)local_78 + (long)iVar4),local_68,(long)(int)(local_9f & 3));
      }
    }
    uVar1 = ntohs(local_a8);
    uVar5 = (uint)local_9f;
    uVar3 = ntohs(local_a4);
    if ((uVar1 & 0x3ff) == (int)((uVar5 & 3) + (uVar3 & 0xfff) + 3) >> 2) {
      uVar1 = ntohs(local_a4);
      return (int)(uVar1 & 0xfff) + local_30;
    }
    uVar1 = ntohs(local_a8);
    local_30 = (int)((uVar1 & 0x3ff) << 2) + local_30;
  } while( true );
}

Assistant:

static ssize_t libtlp_read_cpld(struct nettlp *nt, void *buf,
				size_t count)
{
	int ret = 0;
	ssize_t received;
	char rest[16];	/* additional buffer for gap of 4WD-aligned bytes */
	struct pollfd x[1];
	struct iovec iov[4];
	struct nettlp_hdr nh;
	struct tlp_cpl_hdr ch;

	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &ch;
	iov[1].iov_len = sizeof(ch);
	iov[3].iov_base = rest;
	iov[3].iov_len = sizeof(rest);
	x[0].fd = nt->sockfd;
	x[0].events = POLLIN;

	received = 0;

	while (1) {

		ret = poll(x, 1, LIBTLP_CPL_TIMEOUT);
		if (ret < 0)
			goto err_out;

		if (ret == 0) {
			ret = -1;
			errno = ETIME;
			goto err_out;
		}

		if (!(x[0].revents & POLLIN))
			goto err_out;

		iov[2].iov_base = buf + received;
		iov[2].iov_len = count - received;
		ret = readv(nt->sockfd, iov, 4);
		if (ret < 0)
			goto err_out;

		if (!(tlp_is_cpl(ch.tlp.fmt_type) &&
		      tlp_is_w_data(ch.tlp.fmt_type))) {
			/* invalid data type */
			errno = EBADMSG;
			ret = -1;
			goto err_out;
		}

		if (tlp_cpl_status(ch.stcnt) != TLP_CPL_STATUS_SC) {
			switch (tlp_cpl_status(ch.stcnt)) {
			case TLP_CPL_STATUS_UR:
				errno = EOPNOTSUPP;
				ret = -1;
				goto err_out;
			case TLP_CPL_STATUS_CRS:
				errno = EINVAL;
				ret = -1;
				goto err_out;
			case TLP_CPL_STATUS_CA:
				errno = ECONNABORTED;
				ret = -1;
				goto err_out;
			}
		}
		
		if (ch.lowaddr & 0x3) {
			/* note: iov[2].iov_len must be identical with
			 * byte count. current buffer layout is:
			 *
			 * |-low & 0x3-|----byte cnt----|-Last BE-|
			 * |----------------|---------------------------|
			 *       iov[2]                iov[3]
			 *
			 * So, move bytecnt bytes from iov[2].base +
			 * (lowaddr & 0x3) across iov[2] and iov[3].
			 * 
			 * or
			 *
			 * |-low & 0x3-|-BC-|
			 * |----|-------------------------------------|
			 * iov[2]                iov[3]
			 *
			 * iov[2].len is shorter than (lowaddr & 0x3).
			 * mv bytecnt bytes from iov[3] + ((lowaddr &
			 * 0x3) - iov[2].len) to iov[2].
			 */
			int diff = iov[2].iov_len - (ch.lowaddr & 0x3);

			if (diff > 0) {
				memmove(iov[2].iov_base,
					iov[2].iov_base + (ch.lowaddr & 0x3),
					diff);

				memmove(iov[2].iov_base + diff,
					iov[3].iov_base,
					ch.lowaddr & 0x3);
			} else {
				diff = (ch.lowaddr & 0x3) - iov[2].iov_len;
				memmove(iov[2].iov_base,
					iov[3].iov_base + diff,
					tlp_cpl_bcnt(ch.stcnt));
			}
		}

		if (tlp_length(ch.tlp.falen) ==
		    ((ch.lowaddr & 0x3) + tlp_cpl_bcnt(ch.stcnt) + 3) >> 2) {

			/* last CplD.
			 * see http://xillybus.com/tutorials/
			 * pci-express-tlp-pcie-primer-tutorial-guide-1
			 */
			received += tlp_cpl_bcnt(ch.stcnt);
			break;
		} else {
			received += tlp_length(ch.tlp.falen) << 2;
		}
	}

out:
	return received;

err_out:
	return ret;
}